

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O2

void check_table(wasm_table_t *table,int32_t i,_Bool expect_set)

{
  long lVar1;
  
  lVar1 = wasm_table_get();
  check((lVar1 != 0) == expect_set);
  if (lVar1 != 0) {
    wasm_ref_delete(lVar1);
    return;
  }
  return;
}

Assistant:

void check_table(wasm_table_t* table, int32_t i, bool expect_set) {
  own wasm_ref_t* ref = wasm_table_get(table, i);
  check((ref != NULL) == expect_set);
  if (ref) wasm_ref_delete(ref);
}